

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O2

int Abc_NtkMfsEdgePower(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  Abc_Obj_t *pObj;
  int iVar1;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  do {
    if ((pNode->vFanins).nSize <= lVar2) {
      return 0;
    }
    pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar2]];
    fVar3 = Abc_MfsObjProb(p,pObj);
    iVar1 = 1;
    if (0.35 <= fVar3) {
      iVar1 = 0;
LAB_003cc3cc:
      iVar1 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar2,iVar1,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      fVar3 = Abc_MfsObjProb(p,pObj);
      if (0.25 <= fVar3) goto LAB_003cc3cc;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int Abc_NtkMfsEdgePower( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
	{
        if ( Abc_MfsObjProb(p, pFanin) >= 0.35 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        } else if ( Abc_MfsObjProb(p, pFanin) >= 0.25 ) // sjang
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                return 1;
        }
        }
    return 0;
}